

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_feat_graphics(parser *p)

{
  wchar_t wVar1;
  char *__s;
  void *pvVar2;
  size_t sVar3;
  feature *f;
  wchar_t attr;
  char *color;
  wchar_t glyph;
  parser *p_local;
  
  wVar1 = parser_getchar(p,"glyph");
  __s = parser_getsym(p,"color");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(wchar_t *)((long)pvVar2 + 0x28) = wVar1;
    sVar3 = strlen(__s);
    if (sVar3 < 2) {
      f._4_4_ = color_char_to_attr(*__s);
    }
    else {
      f._4_4_ = color_text_to_attr(__s);
    }
    if (f._4_4_ < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_COLOR;
    }
    else {
      *(char *)((long)pvVar2 + 0x27) = (char)f._4_4_;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_feat_graphics(struct parser *p) {
	wchar_t glyph = parser_getchar(p, "glyph");
	const char *color = parser_getsym(p, "color");
	int attr = 0;
	struct feature *f = parser_priv(p);

	if (!f)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	f->d_char = glyph;
	if (strlen(color) > 1)
		attr = color_text_to_attr(color);
	else
		attr = color_char_to_attr(color[0]);
	if (attr < 0)
		return PARSE_ERROR_INVALID_COLOR;
	f->d_attr = attr;
	return PARSE_ERROR_NONE;
}